

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O1

bool __thiscall
arangodb::velocypack::Builder::closeCompactArrayOrObject
          (Builder *this,ValueLength pos,bool isArray,iterator indexStart,iterator indexEnd)

{
  Buffer<unsigned_char> *pBVar1;
  ValueLength VVar2;
  ValueLength VVar3;
  pointer pCVar4;
  bool bVar5;
  long lVar6;
  byte *pbVar7;
  pointer puVar8;
  ulong uVar9;
  ulong uVar10;
  size_t __n;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong len;
  ulong uVar14;
  
  uVar14 = (long)indexEnd._M_current - (long)indexStart._M_current >> 3;
  lVar12 = 1;
  len = 1;
  uVar11 = uVar14;
  if (0x7f < uVar14) {
    do {
      len = len + 1;
      bVar5 = 0x3fff < uVar11;
      uVar11 = uVar11 >> 7;
    } while (bVar5);
  }
  uVar11 = ((len - pos) + this->_pos) - 8;
  if (0x7f < uVar11) {
    lVar12 = 1;
    uVar13 = uVar11;
    do {
      lVar12 = lVar12 + 1;
      bVar5 = 0x3fff < uVar13;
      uVar13 = uVar13 >> 7;
    } while (bVar5);
  }
  uVar11 = uVar11 + lVar12;
  lVar6 = 1;
  uVar13 = uVar11;
  if (0x7f < uVar11) {
    do {
      lVar6 = lVar6 + 1;
      bVar5 = 0x3fff < uVar13;
      uVar13 = uVar13 >> 7;
    } while (bVar5);
  }
  uVar13 = lVar12 + (ulong)(lVar6 != lVar12);
  if (uVar13 < 9) {
    uVar11 = uVar11 + (lVar6 != lVar12);
    this->_start[pos] = '\x14' - isArray;
    __n = this->_pos - (pos + 9);
    if (pos + 9 <= this->_pos && __n != 0) {
      memmove(this->_start + uVar13 + pos + 1,this->_start + pos + 9,__n);
    }
    pbVar7 = this->_start + pos + 1;
    uVar9 = uVar11;
    uVar10 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar7 = (byte)uVar9 | 0x80;
        pbVar7 = pbVar7 + 1;
        uVar10 = uVar9 >> 7;
        bVar5 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar5);
    }
    *pbVar7 = (byte)uVar10;
    if (8 - uVar13 < len) {
      reserve(this,len);
    }
    pbVar7 = this->_start + uVar11 + pos + -1;
    uVar11 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar7 = (byte)uVar11 | 0x80;
        pbVar7 = pbVar7 + -1;
        uVar14 = uVar11 >> 7;
        bVar5 = 0x3fff < uVar11;
        uVar11 = uVar14;
      } while (bVar5);
    }
    *pbVar7 = (byte)uVar14;
    pBVar1 = this->_bufferPtr;
    VVar2 = this->_pos;
    this->_pos = VVar2 - 8;
    VVar3 = pBVar1->_size;
    pBVar1->_size = VVar3 - 8;
    this->_pos = (VVar2 + len + uVar13) - 8;
    pBVar1->_size = (VVar3 - 8) + len + uVar13;
    pCVar4 = (this->_stack).
             super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    VVar2 = pCVar4[-1].indexStartPos;
    (this->_stack).
    super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar4 + -1;
    puVar8 = (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start + VVar2;
    if (puVar8 != (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar8;
    }
  }
  return uVar13 < 9;
}

Assistant:

bool Builder::closeCompactArrayOrObject(
    ValueLength pos, bool isArray,
    std::vector<ValueLength>::iterator indexStart,
    std::vector<ValueLength>::iterator indexEnd) {
  std::size_t const n = std::distance(indexStart, indexEnd);

  // use compact notation
  ValueLength nLen = getVariableValueLength(static_cast<ValueLength>(n));
  VELOCYPACK_ASSERT(nLen > 0);
  ValueLength byteSize = _pos - (pos + 8) + nLen;
  VELOCYPACK_ASSERT(byteSize > 0);
  ValueLength bLen = getVariableValueLength(byteSize);
  byteSize += bLen;
  if (getVariableValueLength(byteSize) != bLen) {
    byteSize += 1;
    bLen += 1;
  }

  if (bLen < 9) {
    // can only use compact notation if total byte length is at most 8 bytes
    // long
    _start[pos] = (isArray ? 0x13 : 0x14);
    ValueLength targetPos = 1 + bLen;

    if (_pos > (pos + 9)) {
      ValueLength len = _pos - (pos + 9);
      memmove(_start + pos + targetPos, _start + pos + 9, checkOverflow(len));
    }

    // store byte length
    VELOCYPACK_ASSERT(byteSize > 0);
    storeVariableValueLength<false>(_start + pos + 1, byteSize);

    // need additional memory for storing the number of values
    if (nLen > 8 - bLen) {
      reserve(nLen);
    }
    storeVariableValueLength<true>(_start + pos + byteSize - 1,
                                   static_cast<ValueLength>(n));

    rollback(8);
    advance(nLen + bLen);

    closeLevel();

#ifdef VELOCYPACK_DEBUG
    VELOCYPACK_ASSERT(_start[pos] == (isArray ? 0x13 : 0x14));
    VELOCYPACK_ASSERT(byteSize ==
                      readVariableValueLength<false>(_start + pos + 1));
    VELOCYPACK_ASSERT(isArray || _start[pos + 1 + bLen] != 0x00);
    VELOCYPACK_ASSERT(
        n == readVariableValueLength<true>(_start + pos + byteSize - 1));
#endif
    return true;
  }
  return false;
}